

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

uint log_var_update_state(log_var_t *log_var)

{
  _Bool _Var1;
  undefined4 *in_RDI;
  char *segment_end;
  char *segment_begin;
  char *log_var_end;
  char *log_var_begin;
  _Bool result;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar2;
  char *local_70;
  uint uStack_4c;
  
  strlen(*(char **)(in_RDI + 2));
  local_70 = log_var_names;
  uVar2 = 2;
  if ((log_init_done.repr & 1U) == 0) {
    uStack_4c = 1;
  }
  else {
    while( true ) {
      local_70 = log_var_extract_segment(local_70);
      _Var1 = log_var_matches_segment
                        ((char *)CONCAT44(uVar2,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60
                         ,in_stack_ffffffffffffff58,
                         (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      if (_Var1) break;
      if (*local_70 == '\0') {
        *in_RDI = 1;
        return 1;
      }
      local_70 = local_70 + 1;
    }
    *in_RDI = 2;
    uStack_4c = 2;
  }
  return uStack_4c;
}

Assistant:

unsigned
log_var_update_state(log_var_t *log_var) {
	const char *log_var_begin = log_var->name;
	const char *log_var_end = log_var->name + strlen(log_var->name);

	/* Pointer to one before the beginning of the current segment. */
	const char *segment_begin = log_var_names;

	/*
	 * If log_init done is false, we haven't parsed the malloc conf yet.  To
	 * avoid log-spew, we default to not displaying anything.
	 */
	if (!atomic_load_b(&log_init_done, ATOMIC_ACQUIRE)) {
		return LOG_INITIALIZED_NOT_ENABLED;
	}

	while (true) {
		const char *segment_end = log_var_extract_segment(
		    segment_begin);
		assert(segment_end < log_var_names + JEMALLOC_LOG_VAR_BUFSIZE);
		if (log_var_matches_segment(segment_begin, segment_end,
		    log_var_begin, log_var_end)) {
			atomic_store_u(&log_var->state, LOG_ENABLED,
			    ATOMIC_RELAXED);
			return LOG_ENABLED;
		}
		if (*segment_end == '\0') {
			/* Hit the end of the segment string with no match. */
			atomic_store_u(&log_var->state,
			    LOG_INITIALIZED_NOT_ENABLED, ATOMIC_RELAXED);
			return LOG_INITIALIZED_NOT_ENABLED;
		}
		/* Otherwise, skip the delimiter and continue. */
		segment_begin = segment_end + 1;
	}
}